

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

int Sle_ManCutHasPisOnly(int *pCut,Vec_Bit_t *vMask)

{
  uint uVar1;
  ulong uVar2;
  
  if ((*pCut & 0xfU) != 0) {
    uVar2 = 0;
    do {
      uVar1 = pCut[uVar2 + 1];
      if (((int)uVar1 < 0) || (vMask->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if (((uint)vMask->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) {
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while (((ulong)(uint)*pCut & 0xf) != uVar2);
  }
  return 1;
}

Assistant:

int Sle_ManCutHasPisOnly( int * pCut, Vec_Bit_t * vMask )
{
    int k, * pC = Sle_CutLeaves(pCut);
    for ( k = 0; k < Sle_CutSize(pCut); k++ )
        if ( Vec_BitEntry(vMask, pC[k]) ) // internal node
            return 0;
    return 1;
}